

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropResizeLayerParams::InternalSwap
          (CropResizeLayerParams *this,CropResizeLayerParams *other)

{
  CropResizeLayerParams *other_local;
  CropResizeLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetsize_,&other->targetsize_);
  std::swap<CoreML::Specification::SamplingMode*>(&this->mode_,&other->mode_);
  std::swap<CoreML::Specification::BoxCoordinatesMode*>
            (&this->boxindicesmode_,&other->boxindicesmode_);
  std::swap<bool>(&this->normalizedcoordinates_,&other->normalizedcoordinates_);
  std::swap<float>(&this->spatialscale_,&other->spatialscale_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void CropResizeLayerParams::InternalSwap(CropResizeLayerParams* other) {
  targetsize_.InternalSwap(&other->targetsize_);
  std::swap(mode_, other->mode_);
  std::swap(boxindicesmode_, other->boxindicesmode_);
  std::swap(normalizedcoordinates_, other->normalizedcoordinates_);
  std::swap(spatialscale_, other->spatialscale_);
  std::swap(_cached_size_, other->_cached_size_);
}